

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi-type-conversions.cpp
# Opt level: O0

int main(void)

{
  ompi_communicator_t *in_stack_00000010;
  environment env;
  environment *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  diy::mpi::environment::environment(in_stack_ffffffffffffffc0);
  TestConversions<ompi_communicator_t_*,_diy::mpi::communicator>::Run(in_stack_00000010);
  TestConversions<ompi_datatype_t_*,_diy::mpi::datatype>::Run
            ((ompi_datatype_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  TestConversions<ompi_op_t_*,_diy::mpi::operation>::Run
            ((ompi_op_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  TestConversions<ompi_status_public_t,_diy::mpi::status>::Run((ompi_status_public_t)_env);
  diy::mpi::environment::~environment((environment *)0x10b250);
  return 0;
}

Assistant:

int main()
{
  diy::mpi::environment env;

  TestConversions<MPI_Comm, diy::mpi::communicator>::Run(MPI_COMM_WORLD);
  TestConversions<MPI_Datatype, diy::mpi::datatype>::Run();
  TestConversions<MPI_Op, diy::mpi::operation>::Run();
  TestConversions<MPI_Status, diy::mpi::status>::Run();

  // This test is expected to pass or fail during compilation
  return 0;
}